

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_VavoomSlope(sector_t_conflict *sec,int id,DVector3 *pos,int which)

{
  double *pdVar1;
  line_t_conflict *plVar2;
  splane *psVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (0 < (long)sec->linecount) {
    lVar4 = 0;
    do {
      plVar2 = sec->lines[lVar4];
      if (plVar2->args[0] == id) {
        lVar4 = 0xd8;
        psVar3 = sec->planes + 1;
        if (which == 0) {
          lVar4 = 0xb0;
          psVar3 = sec->planes;
        }
        dVar9 = pos->Z - psVar3->TexZ;
        dVar7 = pos->Y - (plVar2->v2->p).Y;
        dVar8 = pos->X - (plVar2->v1->p).X;
        dVar5 = pos->Y - (plVar2->v1->p).Y;
        dVar6 = pos->X - (plVar2->v2->p).X;
        dVar10 = dVar9 * dVar7 - dVar5 * dVar9;
        dVar9 = dVar9 * dVar8 - dVar6 * dVar9;
        dVar5 = dVar6 * dVar5 - dVar8 * dVar7;
        dVar6 = c_sqrt(dVar5 * dVar5 + dVar9 * dVar9 + dVar10 * dVar10);
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          Printf("Slope thing at (%f,%f) lies directly on its target line.\n",pos->X,pos->Y);
          return;
        }
        dVar6 = 1.0 / dVar6;
        dVar10 = dVar6 * dVar10;
        dVar9 = dVar6 * dVar9;
        dVar6 = dVar6 * dVar5;
        if (((which == 0) && (dVar6 < 0.0)) || ((which == 1 && (0.0 < dVar6)))) {
          dVar10 = -dVar10;
          dVar9 = -dVar9;
          dVar6 = -dVar6;
        }
        dVar5 = pos->X;
        dVar7 = pos->Y;
        dVar8 = pos->Z;
        pdVar1 = (double *)((long)&sec->planes[0].xform.xOffs + lVar4);
        *pdVar1 = dVar10;
        pdVar1[1] = dVar9;
        *(double *)((long)&sec->planes[0].xform.baseyOffs + lVar4) = dVar6;
        *(double *)((long)&sec->planes[0].xform.xScale + lVar4) =
             (-dVar10 * dVar5 - dVar9 * dVar7) - dVar8 * dVar6;
        *(double *)((long)&sec->planes[0].xform.yScale + lVar4) = -1.0 / dVar6;
        return;
      }
      lVar4 = lVar4 + 1;
    } while (sec->linecount != lVar4);
  }
  return;
}

Assistant:

void P_VavoomSlope(sector_t * sec, int id, const DVector3 &pos, int which)
{
	for (int i=0;i<sec->linecount;i++)
	{
		line_t * l=sec->lines[i];

		if (l->args[0]==id)
		{
			DVector3 v1, v2, cross;
			secplane_t *srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
			double srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);

			v1[0] = pos.X - l->v2->fX();
			v1[1] = pos.Y - l->v2->fY();
			v1[2] = pos.Z - srcheight;
			
			v2[0] = pos.X - l->v1->fX();
			v2[1] = pos.Y - l->v1->fY();
			v2[2] = pos.Z - srcheight;

			cross = v1 ^ v2;
			double len = cross.Length();
			if (len == 0)
			{
				Printf ("Slope thing at (%f,%f) lies directly on its target line.\n", pos.X, pos.Y);
				return;
			}
			cross /= len;

			// Fix backward normals
			if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
			{
				cross = -cross;
			}

			double dist = -cross[0] * pos.X - cross[1] * pos.Y - cross[2] * pos.Z;
			srcplane->set(cross[0], cross[1], cross[2], dist);
			return;
		}
	}
}